

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O0

void __thiscall asmjit::CodeCompiler::CodeCompiler(CodeCompiler *this)

{
  CodeBuilder *in_RDI;
  
  CodeBuilder::CodeBuilder(in_RDI);
  (in_RDI->super_CodeEmitter)._vptr_CodeEmitter = (_func_int **)&PTR__CodeCompiler_001dc5d8;
  in_RDI[1].super_CodeEmitter._vptr_CodeEmitter = (_func_int **)0x0;
  Zone::Zone((Zone *)&in_RDI[1].super_CodeEmitter._codeInfo,0xfc0,0);
  in_RDI[1].super_CodeEmitter._type = '\0';
  in_RDI[1].super_CodeEmitter._destroyed = '\0';
  in_RDI[1].super_CodeEmitter._finalized = '\0';
  in_RDI[1].super_CodeEmitter._reserved = '\0';
  in_RDI[1].super_CodeEmitter._lastError = 0;
  in_RDI[1].super_CodeEmitter._privateData = 0;
  in_RDI[1].super_CodeEmitter._globalHints = 0;
  in_RDI[1].super_CodeEmitter._globalOptions = 0;
  in_RDI[1].super_CodeEmitter._options = 0;
  in_RDI[1].super_CodeEmitter._extraReg._signature = 0;
  in_RDI[1].super_CodeEmitter._extraReg._id = 0;
  in_RDI[1].super_CodeEmitter._inlineComment = (char *)0x0;
  (in_RDI->super_CodeEmitter)._type = '\x03';
  return;
}

Assistant:

CodeCompiler::CodeCompiler() noexcept
  : CodeBuilder(),
    _func(nullptr),
    _vRegZone(4096 - Zone::kZoneOverhead),
    _vRegArray(),
    _localConstPool(nullptr),
    _globalConstPool(nullptr) {

  _type = kTypeCompiler;
}